

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O3

void Js::JavascriptOperators::TryCacheMissingProperty
               (Var instance,Var cacheInstance,bool isRoot,PropertyId propertyId,
               ScriptContext *requestContext,PropertyValueInfo *info)

{
  bool bVar1;
  int iVar2;
  DynamicObject *pDVar3;
  
  bVar1 = Phases::IsEnabled((Phases *)&DAT_015a4e90,MissingPropertyCachePhase);
  if (!bVar1 && !isRoot) {
    bVar1 = DynamicObject::IsBaseDynamicObject(instance);
    if ((!bVar1) && (bVar1 = DynamicObject::IsAnyArray(instance), !bVar1)) {
      return;
    }
    pDVar3 = UnsafeVarTo<Js::DynamicObject>(instance);
    if (((((pDVar3->super_RecyclableObject).type.ptr)->flags & TypeFlagMask_JsrtExternal) ==
         TypeFlagMask_None) ||
       ((requestContext->threadContext->disableImplicitFlags & DisableImplicitCallFlag) ==
        DisableImplicitNoFlag)) {
      pDVar3 = UnsafeVarTo<Js::DynamicObject>(instance);
      iVar2 = (**(code **)(**(long **)((pDVar3->super_RecyclableObject).type.ptr + 1) + 0x270))();
      if (iVar2 != 0) {
        bVar1 = Phases::IsEnabled((Phases *)&DAT_015b3868,MissingPropertyCachePhase);
        if (bVar1) {
          ScriptContext::RecordMissingPropertyCacheAttempt(requestContext);
        }
        bVar1 = Phases::IsEnabled((Phases *)&DAT_015b6718,MissingPropertyCachePhase);
        if (bVar1) {
          Output::Print(L"MissingPropertyCache: Caching missing property for property %d.\n",
                        (ulong)(uint)propertyId);
        }
        pDVar3 = (((requestContext->super_ScriptContextBase).javascriptLibrary)->
                 missingPropertyHolder).ptr;
        if (info != (PropertyValueInfo *)0x0) {
          info->m_instance = &pDVar3->super_RecyclableObject;
          info->m_propertyIndex = 0;
          info->m_attributes = '\x04';
          info->flags = InlineCacheNoFlags;
        }
        CacheOperators::CachePropertyRead
                  (cacheInstance,&pDVar3->super_RecyclableObject,false,propertyId,true,info,
                   requestContext);
      }
    }
  }
  return;
}

Assistant:

void JavascriptOperators::TryCacheMissingProperty(Var instance, Var cacheInstance, bool isRoot, PropertyId propertyId, ScriptContext* requestContext, _Inout_ PropertyValueInfo * info)
    {
        // Here, any well-behaved subclasses of DynamicObject can opt in to getting included in the missing property cache.
        // For now, we only include basic objects and arrays. 
        if (PHASE_OFF1(MissingPropertyCachePhase) || isRoot || !(DynamicObject::IsBaseDynamicObject(instance) || DynamicObject::IsAnyArray(instance)))
        {
            return;
        }

        // CustomExternalObject in particular is problematic because in some cases it can report missing when implicit callsare disabled.
        // See CustomExternalObject::GetPropertyQuery for an example.
        if (UnsafeVarTo<DynamicObject>(instance)->GetType()->IsJsrtExternal() && requestContext->GetThreadContext()->IsDisableImplicitCall())
        {
            return;
        }

        DynamicTypeHandler* handler = UnsafeVarTo<DynamicObject>(instance)->GetDynamicType()->GetTypeHandler();

        // Only cache missing property lookups for non-root field loads on objects that have PathTypeHandlers, because only these types have the right behavior
        // when the missing property is later added. DictionaryTypeHandler's introduce the possibility that a stale TypePropertyCache entry with isMissing==true can
        // be left in the cache after the property has been installed in the object's prototype chain. Other changes to optimize accesses to objects that don't
        // override special symbols make it unnecessary to introduce an invalidation scheme to deal with DictionaryTypeHandler's.

        if (!handler->IsPathTypeHandler())
        {
            return;
        }

#ifdef MISSING_PROPERTY_STATS
        if (PHASE_STATS1(MissingPropertyCachePhase))
        {
            requestContext->RecordMissingPropertyCacheAttempt();
        }
#endif
        if (PHASE_TRACE1(MissingPropertyCachePhase))
        {
            Output::Print(_u("MissingPropertyCache: Caching missing property for property %d.\n"), propertyId);
        }

        PropertyValueInfo::Set(info, requestContext->GetLibrary()->GetMissingPropertyHolder(), 0);
        CacheOperators::CachePropertyRead(cacheInstance, requestContext->GetLibrary()->GetMissingPropertyHolder(), isRoot, propertyId, true /*isMissing*/, info, requestContext);
    }